

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O1

spv_result_t spvtools::val::AnnotationPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  ushort uVar2;
  pointer ppVar3;
  _Rb_tree_const_iterator<spvtools::val::Decoration> __first;
  bool bVar4;
  Decoration DVar5;
  spv_result_t id;
  uint uVar6;
  uint uVar7;
  FPFastMathModeMask FVar8;
  spv_result_t sVar9;
  Instruction *pIVar10;
  _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
  *p_Var11;
  mapped_type *pmVar12;
  pointer puVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  size_t sVar18;
  pointer ppVar19;
  bool bVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dec_params;
  string local_258;
  ValidationState_t *local_230;
  string local_228;
  undefined1 local_208 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_200;
  uint local_1e8;
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0x47:
    DVar5 = Instruction::GetOperandAs<spv::Decoration>(inst,1);
    uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar10 = ValidationState_t::FindDef(_,uVar6);
    if (pIVar10 == (Instruction *)0x0) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "target is not defined";
      lVar15 = 0x15;
    }
    else {
      bVar20 = spvIsVulkanEnv(_->context_->target_env);
      if (((DVar5 & ~DecorationSpecId) == DecorationGLSLShared) && (bVar20)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_258,_,0x123d,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"OpDecorate decoration \'",0x17);
        ValidationState_t::SpvDecorationString_abi_cxx11_(&local_228,_,DVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_228._M_dataplus._M_p._4_4_,
                                    (uint)local_228._M_dataplus._M_p),local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"\' is not valid for the Vulkan execution environment.",0x34
                  );
        sVar9 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p) !=
            &local_228.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_228._M_dataplus._M_p._4_4_,(uint)local_228._M_dataplus._M_p
                                  ),local_228.field_2._M_allocated_capacity + 1);
        }
LAB_00139d31:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        break;
      }
      if (DVar5 == DecorationFPFastMathMode) {
        bVar20 = ValidationState_t::HasDecoration(_,uVar6,DecorationNoContraction);
        if (!bVar20) {
          local_230 = _;
          FVar8 = Instruction::GetOperandAs<spv::FPFastMathModeMask>(inst,2);
          _ = local_230;
          if ((~FVar8 & 0x30000) != 0 && (FVar8 >> 0x12 & 1) != 0) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_208,local_230,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,
                       "AllowReassoc and AllowContract must be specified when AllowTransform is specified"
                       ,0x51);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            _ = local_230;
            sVar9 = local_38;
            break;
          }
          goto LAB_00139dce;
        }
LAB_00139c27:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar17 = "FPFastMathMode and NoContraction cannot decorate the same target";
        lVar15 = 0x40;
      }
      else {
LAB_00139dce:
        if ((int)DVar5 < 0x2e) {
          if (DVar5 != DecorationUniformId) {
            if (DVar5 != DecorationNoContraction) goto LAB_0013a0b6;
            bVar20 = ValidationState_t::HasDecoration(_,uVar6,DecorationFPFastMathMode);
            if (!bVar20) goto LAB_00139dde;
            goto LAB_00139c27;
          }
        }
        else if (1 < DVar5 - AlignmentId) {
LAB_00139dde:
          if (DVar5 != CounterBuffer) {
LAB_0013a0b6:
            if ((pIVar10->inst_).opcode != 0x49) {
              if ((DVar5 < DecorationGLSLShared) && ((0xb0U >> (DVar5 & Component) & 1) != 0)) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                ValidationState_t::SpvDecorationString_abi_cxx11_(&local_258,_,DVar5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_258._M_dataplus._M_p,
                           local_258._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208," can only be applied to structure members",0x29);
                sVar9 = local_38;
                goto LAB_00139d31;
              }
              sVar9 = anon_unknown_3::ValidateDecorationTarget(_,DVar5,inst,pIVar10);
              if (sVar9 != SPV_SUCCESS) break;
            }
LAB_001398c2:
            sVar9 = SPV_SUCCESS;
            break;
          }
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar17 = "Decorations taking ID parameters may not be used with OpDecorateId";
        lVar15 = 0x42;
      }
    }
LAB_00139e50:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar17,lVar15);
LAB_00139e62:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar9 = local_38;
    break;
  case 0x48:
    uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar10 = ValidationState_t::FindDef(_,uVar6);
    if ((pIVar10 == (Instruction *)0x0) || ((pIVar10->inst_).opcode != 0x1e)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpMemberDecorate Structure type <id> ",0x25);
      ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      pcVar17 = " is not a struct type.";
      lVar15 = 0x16;
LAB_00139b9d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar17,lVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00139e62;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    if ((int)((ulong)((long)(pIVar10->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(pIVar10->words_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2) - 2U <= uVar7) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Index ",6);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," provided in OpMemberDecorate for struct <id> ",0x2e);
      ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," is out of bounds. The structure has ",0x25);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," members. Largest valid index is ",0x21);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
      sVar9 = local_38;
      goto LAB_00139d31;
    }
    DVar5 = Instruction::GetOperandAs<spv::Decoration>(inst,2);
    sVar9 = SPV_SUCCESS;
    if ((int)DVar5 < 0x1175) {
      if ((DVar5 < (DecorationIndex|Centroid)) &&
         ((0xffc71c50074eU >> ((ulong)DVar5 & 0x3f) & 1) != 0)) {
LAB_00139a69:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::SpvDecorationString_abi_cxx11_(&local_258,_,DVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," cannot be applied to structure members",0x27);
        sVar9 = local_38;
        goto LAB_00139d31;
      }
    }
    else if ((((DVar5 - DecorationNonUniform < 0x39) &&
              ((0x180000000000001U >> ((ulong)(DVar5 - DecorationNonUniform) & 0x3f) & 1) != 0)) ||
             (DVar5 - DecorationNoSignedWrap < 2)) || (DVar5 == CounterBuffer)) goto LAB_00139a69;
    break;
  case 0x49:
    uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar10 = ValidationState_t::FindDef(_,uVar6);
    ppVar19 = (pIVar10->uses_).
              super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = (pIVar10->uses_).
             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = SPV_SUCCESS;
    if (ppVar19 != ppVar3) {
      do {
        uVar2 = (ppVar19->first->inst_).opcode;
        bVar20 = true;
        if ((((4 < uVar2 - 0x47) || ((0x19U >> (uVar2 - 0x47 & 0x1f) & 1) == 0)) && (uVar2 != 5)) &&
           ((uVar2 != 0x14c && (bVar4 = Instruction::IsNonSemantic(ppVar19->first), !bVar4)))) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Result id of OpDecorationGroup can only ",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"be targeted by OpName, OpGroupDecorate, ",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpDecorate, OpDecorateId, and OpGroupMemberDecorate",0x33
                    );
          local_230 = (ValidationState_t *)CONCAT44(local_230._4_4_,local_38);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          bVar20 = false;
        }
        if (!bVar20) goto LAB_00139bd1;
        ppVar19 = ppVar19 + 1;
      } while (ppVar19 != ppVar3);
      goto LAB_001398c2;
    }
    break;
  case 0x4a:
    id = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar10 = ValidationState_t::FindDef(_,id);
    if ((pIVar10 == (Instruction *)0x0) || ((pIVar10->inst_).opcode != 0x49)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "OpGroupDecorate Decoration group <id> ";
      lVar15 = 0x26;
LAB_00139b0d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar17,lVar15);
      ValidationState_t::getIdName_abi_cxx11_(&local_258,_,id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
      pcVar17 = " is not a decoration group.";
      lVar15 = 0x1b;
      goto LAB_00139b9d;
    }
    sVar9 = SPV_SUCCESS;
    if (0x10 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      sVar18 = 1;
      uVar16 = 2;
      do {
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,sVar18);
        pIVar10 = ValidationState_t::FindDef(_,uVar6);
        if ((pIVar10 == (Instruction *)0x0) || (bVar20 = true, (pIVar10->inst_).opcode == 0x49)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpGroupDecorate may not target OpDecorationGroup <id> ",
                     0x36);
          ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
          id = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          bVar20 = false;
        }
        sVar9 = id;
        if (!bVar20) goto LAB_00139e67;
        bVar20 = uVar16 < (ulong)((long)(inst->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4);
        sVar18 = uVar16;
        uVar16 = (ulong)((int)uVar16 + 1);
      } while (bVar20);
      goto LAB_001398c2;
    }
    break;
  case 0x4b:
    id = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar10 = ValidationState_t::FindDef(_,id);
    if ((pIVar10 == (Instruction *)0x0) || ((pIVar10->inst_).opcode != 0x49)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "OpGroupMemberDecorate Decoration group <id> ";
      lVar15 = 0x2c;
      goto LAB_00139b0d;
    }
    sVar9 = SPV_SUCCESS;
    if (0x20 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      sVar18 = 2;
      do {
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,sVar18 - 1);
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar18);
        pIVar10 = ValidationState_t::FindDef(_,uVar6);
        if ((pIVar10 == (Instruction *)0x0) || ((pIVar10->inst_).opcode != 0x1e)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpGroupMemberDecorate Structure type <id> ",0x2a);
          ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
          lVar15 = 0x16;
          pcVar17 = " is not a struct type.";
LAB_0013978a:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar17,lVar15);
          local_230 = (ValidationState_t *)CONCAT44(local_230._4_4_,local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          bVar20 = false;
        }
        else {
          uVar14 = (int)((ulong)((long)(pIVar10->words_).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pIVar10->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) - 2;
          bVar20 = uVar7 < uVar14;
          if (!bVar20) {
            local_230 = (ValidationState_t *)CONCAT44(local_230._4_4_,uVar14);
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Index ",6);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," provided in OpGroupMemberDecorate for struct <id> ",
                       0x33);
            ValidationState_t::getIdName_abi_cxx11_(&local_258,_,uVar6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," is out of bounds. The structure has ",0x25);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," members. Largest valid index is ",0x21);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            lVar15 = 1;
            pcVar17 = ".";
            goto LAB_0013978a;
          }
        }
        if (!bVar20) goto LAB_00139bd1;
        sVar18 = sVar18 + 2;
      } while (sVar18 < (ulong)((long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
      goto LAB_001398c2;
    }
    break;
  default:
    if (uVar1 == 0x14c) {
      DVar5 = Instruction::GetOperandAs<spv::Decoration>(inst,1);
      sVar9 = SPV_SUCCESS;
      if (((DecorationMaxByteOffsetId < DVar5) ||
          ((0xc00008000000U >> ((ulong)DVar5 & 0x3f) & 1) == 0)) && (DVar5 != CounterBuffer)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar17 = "Decorations that don\'t take ID parameters may not be used with OpDecorateId";
        lVar15 = 0x4b;
        goto LAB_00139e50;
      }
      break;
    }
    goto LAB_00139e70;
  }
LAB_00139e67:
  if (sVar9 != SPV_SUCCESS) {
    return sVar9;
  }
LAB_00139e70:
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0x48:
    puVar13 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    uVar6 = puVar13[1];
    uVar7 = puVar13[2];
    DVar5 = puVar13[3];
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    if (0x10 < (ulong)((long)(inst->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar13)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_258,0,puVar13 + 4);
    }
    local_208._0_4_ = DVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_200,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_258);
    local_228._M_dataplus._M_p._0_4_ = uVar6;
    local_1e8 = uVar7;
LAB_00139f61:
    p_Var11 = (_Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
               *)std::
                 map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                 ::operator[](&_->id_decorations_,(key_type *)&local_228);
    std::
    _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
    ::_M_insert_unique<spvtools::val::Decoration_const&>(p_Var11,(Decoration *)local_208);
    if (local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_200.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_258._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_258._M_dataplus._M_p,
                      local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p);
    }
    break;
  case 0x49:
    break;
  case 0x4a:
    local_208._0_4_ =
         (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    pmVar12 = std::
              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
              ::operator[](&_->id_decorations_,(key_type *)local_208);
    puVar13 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar13) < 9) {
      return SPV_SUCCESS;
    }
    uVar16 = 2;
    do {
      local_208._0_4_ = puVar13[uVar16];
      __first._M_node = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var11 = (_Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
                 *)std::
                   map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                   ::operator[](&_->id_decorations_,(key_type *)local_208);
      std::
      _Rb_tree<spvtools::val::Decoration,spvtools::val::Decoration,std::_Identity<spvtools::val::Decoration>,std::less<spvtools::val::Decoration>,std::allocator<spvtools::val::Decoration>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<spvtools::val::Decoration>>
                (p_Var11,__first,
                 (_Rb_tree_const_iterator<spvtools::val::Decoration>)
                 &(pmVar12->_M_t)._M_impl.super__Rb_tree_header);
      uVar16 = uVar16 + 1;
      puVar13 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(inst->words_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar13 >> 2))
    ;
    break;
  case 0x4b:
    local_208._0_4_ =
         (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[1];
    pmVar12 = std::
              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
              ::operator[](&_->id_decorations_,(key_type *)local_208);
    puVar13 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar13) < 0xd) {
      return SPV_SUCCESS;
    }
    uVar16 = 3;
    do {
      ValidationState_t::
      RegisterDecorationsForStructMember<std::_Rb_tree_const_iterator<spvtools::val::Decoration>>
                (_,puVar13[uVar16 - 1],puVar13[uVar16],
                 (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<spvtools::val::Decoration>)
                 &(pmVar12->_M_t)._M_impl.super__Rb_tree_header);
      puVar13 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar16 = uVar16 + 2;
    } while (uVar16 < (ulong)((long)(inst->words_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar13 >> 2))
    ;
    break;
  default:
    if (uVar1 != 0x14c) {
      return SPV_SUCCESS;
    }
  case 0x47:
    puVar13 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    uVar6 = puVar13[1];
    DVar5 = puVar13[2];
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    if (0xc < (ulong)((long)(inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar13)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_258,0,puVar13 + 3);
    }
    local_208._0_4_ = DVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_200,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_258);
    local_1e8 = 0xffffffff;
    local_228._M_dataplus._M_p._0_4_ = uVar6;
    goto LAB_00139f61;
  }
  return SPV_SUCCESS;
LAB_00139bd1:
  sVar9 = (spv_result_t)local_230;
  goto LAB_00139e67;
}

Assistant:

spv_result_t AnnotationPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpDecorate:
      if (auto error = ValidateDecorate(_, inst)) return error;
      break;
    case spv::Op::OpDecorateId:
      if (auto error = ValidateDecorateId(_, inst)) return error;
      break;
    // TODO(dneto): spv::Op::OpDecorateStringGOOGLE
    // See https://github.com/KhronosGroup/SPIRV-Tools/issues/2253
    case spv::Op::OpMemberDecorate:
      if (auto error = ValidateMemberDecorate(_, inst)) return error;
      break;
    case spv::Op::OpDecorationGroup:
      if (auto error = ValidateDecorationGroup(_, inst)) return error;
      break;
    case spv::Op::OpGroupDecorate:
      if (auto error = ValidateGroupDecorate(_, inst)) return error;
      break;
    case spv::Op::OpGroupMemberDecorate:
      if (auto error = ValidateGroupMemberDecorate(_, inst)) return error;
      break;
    default:
      break;
  }

  // In order to validate decoration rules, we need to know all the decorations
  // that are applied to any given <id>.
  RegisterDecorations(_, inst);

  return SPV_SUCCESS;
}